

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O3

void __thiscall tcmalloc::ThreadCache::~ThreadCache(ThreadCache *this)

{
  uint32_t N;
  ulong uVar1;
  ulong uVar2;
  ThreadCache *src;
  
  uVar1 = (ulong)DAT_0012de50;
  if (uVar1 != 0) {
    uVar2 = 0;
    src = this;
    do {
      N = src->list_[0].length_;
      if (N != 0) {
        ReleaseToCentralCache(this,src->list_,(uint32_t)uVar2,N);
        uVar1 = (ulong)DAT_0012de50;
      }
      uVar2 = uVar2 + 1;
      src = (ThreadCache *)(src->list_ + 1);
    } while (uVar2 < uVar1);
  }
  return;
}

Assistant:

ThreadCache::~ThreadCache() {
  // Put unused memory back into central cache
  for (uint32_t cl = 0; cl < Static::num_size_classes(); ++cl) {
    if (list_[cl].length() > 0) {
      ReleaseToCentralCache(&list_[cl], cl, list_[cl].length());
    }
  }
}